

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CS248::Application::loadScene(Application *this,char *filename)

{
  int iVar1;
  ostream *poVar2;
  SceneInfo *sceneInfo;
  Camera originalCanonicalCamera;
  Camera originalCamera;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"Loading scene from file ");
  poVar2 = std::operator<<(poVar2,filename);
  std::endl<char,std::char_traits<char>>(poVar2);
  Camera::Camera(&originalCamera,&this->camera);
  Camera::Camera(&originalCanonicalCamera,&this->canonicalCamera);
  sceneInfo = (SceneInfo *)operator_new(0x18);
  (sceneInfo->nodes).super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (sceneInfo->nodes).super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (sceneInfo->nodes).super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = Collada::ColladaParser::load(filename,sceneInfo);
  if (iVar1 < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: scene file failed to load.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::~vector
              ((vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *)sceneInfo);
    operator_delete(sceneInfo);
  }
  else {
    load(this,sceneInfo);
    loadSkeleton(this,filename,this->scene);
    memcpy(&this->camera,&originalCamera,0xe0);
    memcpy(&this->canonicalCamera,&originalCanonicalCamera,0xe0);
  }
  return;
}

Assistant:

void Application::loadScene(const char *filename) {
  cerr << "Loading scene from file " << filename << endl;

  Camera originalCamera = camera;
  Camera originalCanonicalCamera = canonicalCamera;

  Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
  if (Collada::ColladaParser::load(filename, sceneInfo) < 0) {
    cerr << "Warning: scene file failed to load." << endl;
    delete sceneInfo;
    return;
  }
  load(sceneInfo);
  loadSkeleton(filename, scene);

  camera = originalCamera;
  canonicalCamera = originalCanonicalCamera;
}